

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

void hmm_clear_scores(hmm_t *h)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  hmm_state_t *phVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  h->state[0].score = -0x38000000;
  auVar4 = _DAT_0014dee0;
  auVar3 = _DAT_0014dce0;
  auVar2 = _DAT_0014dcd0;
  bVar1 = h->n_emit_state;
  if (1 < (ulong)bVar1) {
    lVar5 = (ulong)bVar1 - 2;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    phVar6 = h->state;
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0014dce0;
    do {
      phVar6 = phVar6 + 4;
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar7;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      auVar11 = (auVar10 | auVar2) ^ auVar3;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_)
                & 1)) {
        phVar6[-3].score = -0x38000000;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        phVar6[-2].score = -0x38000000;
      }
      auVar10 = (auVar10 | auVar4) ^ auVar3;
      iVar12 = auVar10._4_4_;
      if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
        phVar6[-1].score = -0x38000000;
        phVar6->score = -0x38000000;
      }
      uVar7 = uVar7 + 4;
    } while ((bVar1 + 2 & 0xfffffffc) != uVar7);
  }
  (h->out).score = -0x38000000;
  h->bestscore = -0x38000000;
  return;
}

Assistant:

void
hmm_clear_scores(hmm_t * h)
{
    int32 i;

    hmm_in_score(h) = WORST_SCORE;
    for (i = 1; i < hmm_n_emit_state(h); i++)
        hmm_score(h, i) = WORST_SCORE;
    hmm_out_score(h) = WORST_SCORE;

    h->bestscore = WORST_SCORE;
}